

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_>::read_next
          (basic_json_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_> *this,
          basic_json_visitor<char> *visitor,error_code *ec)

{
  bool bVar1;
  undefined1 uVar2;
  bool bVar3;
  uint uVar4;
  size_type sVar5;
  undefined7 in_register_00000009;
  error_code *in_RDX;
  sockaddr *__addr;
  int in_ESI;
  int __fd;
  long in_RDI;
  bool eof;
  span<const_char,_18446744073709551615UL> s;
  basic_json_visitor<char> *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  basic_json_parser<char,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  error_code *in_stack_ffffffffffffffc0;
  span<const_char,_18446744073709551615UL> in_stack_ffffffffffffffd8;
  
  basic_json_parser<char,_std::allocator<char>_>::restart
            ((basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 0x28));
  do {
    do {
      bVar1 = basic_json_parser<char,_std::allocator<char>_>::stopped
                        ((basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 0x28));
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return;
      }
      bVar1 = basic_json_parser<char,_std::allocator<char>_>::source_exhausted
                        ((basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 0x28));
      if (bVar1) {
        in_stack_ffffffffffffffd8 =
             json_source_adaptor<jsoncons::string_source<char>_>::read_buffer
                       ((json_source_adaptor<jsoncons::string_source<char>_> *)
                        in_stack_ffffffffffffffd8.size_,
                        (error_code *)in_stack_ffffffffffffffd8.data_);
        bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
        if (bVar1) {
          return;
        }
        sVar5 = detail::span<const_char,_18446744073709551615UL>::size
                          ((span<const_char,_18446744073709551615UL> *)&stack0xffffffffffffffd8);
        if (sVar5 != 0) {
          in_stack_ffffffffffffffb8 =
               (basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 0x28);
          in_stack_ffffffffffffffc0 =
               (error_code *)
               detail::span<const_char,_18446744073709551615UL>::data
                         ((span<const_char,_18446744073709551615UL> *)&stack0xffffffffffffffd8);
          sVar5 = detail::span<const_char,_18446744073709551615UL>::size
                            ((span<const_char,_18446744073709551615UL> *)&stack0xffffffffffffffd8);
          basic_json_parser<char,_std::allocator<char>_>::update
                    (in_stack_ffffffffffffffb8,(char_type *)in_stack_ffffffffffffffc0,sVar5);
          bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
          if (bVar1) {
            return;
          }
        }
      }
      uVar2 = basic_json_parser<char,_std::allocator<char>_>::source_exhausted
                        ((basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 0x28));
      bVar1 = false;
      if ((bool)uVar2) {
        bVar1 = json_source_adaptor<jsoncons::string_source<char>_>::eof
                          ((json_source_adaptor<jsoncons::string_source<char>_> *)0x964cfd);
      }
      __fd = in_ESI;
      basic_json_parser<char,_std::allocator<char>_>::parse_some
                ((basic_json_parser<char,_std::allocator<char>_> *)
                 CONCAT17(bVar1,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8,
                 (error_code *)0x964d23);
      bVar3 = std::error_code::operator_cast_to_bool(in_RDX);
      if (bVar3) {
        return;
      }
    } while (bVar1 == false);
    bVar1 = basic_json_parser<char,_std::allocator<char>_>::enter
                      ((basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 0x28));
    if (bVar1) {
      *(undefined1 *)(in_RDI + 0x180) = 1;
      return;
    }
    uVar4 = basic_json_parser<char,_std::allocator<char>_>::accept
                      ((basic_json_parser<char,_std::allocator<char>_> *)(in_RDI + 0x28),__fd,__addr
                       ,(socklen_t *)CONCAT71(in_register_00000009,uVar2));
  } while ((uVar4 & 1) != 0);
  std::error_code::operator=
            (in_stack_ffffffffffffffc0,(json_errc)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  return;
}

Assistant:

void read_next(basic_json_visitor<CharT>& visitor, std::error_code& ec)
    {
        parser_.restart();
        while (!parser_.stopped())
        {
            if (parser_.source_exhausted())
            {
                auto s = source_.read_buffer(ec);
                if (JSONCONS_UNLIKELY(ec)) {return;}
                if (s.size() > 0)
                {
                    parser_.update(s.data(),s.size());
                    if (JSONCONS_UNLIKELY(ec)) {return;}
                }
            }
            bool eof = parser_.source_exhausted() && source_.eof();
            parser_.parse_some(visitor, ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
            if (eof)
            {
                if (parser_.enter())
                {
                    done_ = true;
                    break;
                }
                else if (!parser_.accept())
                {
                    ec = json_errc::unexpected_eof;
                    return;
                }
            }
        }
    }